

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

free_ptr<MARGINAL::data> scoped_calloc_or_throw<MARGINAL::data>(void)

{
  data *this;
  _Head_base<0UL,_MARGINAL::data_*,_false> extraout_RDX;
  _Tuple_impl<1UL,_void_(*)(void_*)> in_RDI;
  free_ptr<MARGINAL::data> fVar1;
  
  this = calloc_or_throw<MARGINAL::data>(1);
  memset(this,0,0x69a0);
  MARGINAL::data::data(this);
  *(code **)in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       destroy_free<MARGINAL::data>;
  *(data **)((long)in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl + 8) = this;
  fVar1._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
  super__Head_base<0UL,_MARGINAL::data_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  fVar1._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>.
  super__Tuple_impl<1UL,_void_(*)(void_*)>.super__Head_base<1UL,_void_(*)(void_*),_false>.
  _M_head_impl = in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl;
  return (free_ptr<MARGINAL::data>)
         fVar1._M_t.super___uniq_ptr_impl<MARGINAL::data,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_MARGINAL::data_*,_void_(*)(void_*)>;
}

Assistant:

free_ptr<T> scoped_calloc_or_throw()
{
  T* temp = calloc_or_throw<T>(1);
  new (temp) T();
  return std::unique_ptr<T, free_fn>(temp, destroy_free<T>);
}